

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_subarray(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint32_t uVar1;
  JSValue v;
  JSValue v_00;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue val;
  JSValue val_00;
  JSValue this_val_02;
  JSValue JVar2;
  int iVar3;
  JSObject *argv_00;
  long in_R8;
  JSValue JVar4;
  int offset;
  int shift;
  int count;
  int final;
  int start;
  int len;
  JSObject *p;
  JSValue ta_buffer;
  JSValue byteOffset;
  JSValue arr;
  JSValue args [4];
  JSContext *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar5;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar6;
  int in_stack_fffffffffffffea4;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  JSValueUnion in_stack_fffffffffffffeb8;
  JSContext *in_stack_fffffffffffffec0;
  JSValueUnion in_stack_fffffffffffffec8;
  int64_t in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed8 [16];
  JSContext *ctx_00;
  int64_t local_110;
  int local_f8;
  int argc_00;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 local_50;
  undefined4 uStack_4c;
  int64_t local_48;
  
  JVar4.u._4_4_ = in_stack_fffffffffffffeb4;
  JVar4.u.int32 = in_stack_fffffffffffffeb0;
  JVar4.tag = (int64_t)in_stack_fffffffffffffeb8.ptr;
  argv_00 = get_typed_array((JSContext *)
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),JVar4,
                            in_stack_fffffffffffffea4);
  if (argv_00 != (JSObject *)0x0) {
    uVar1 = (argv_00->u).array.count;
    val.tag = in_stack_fffffffffffffed0;
    val.u.ptr = in_stack_fffffffffffffec8.ptr;
    iVar3 = JS_ToInt32Clamp(in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8.ptr,val,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                            in_stack_fffffffffffffed8._8_4_);
    if ((iVar3 == 0) &&
       ((iVar3 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x10)), iVar3 != 0 ||
        (val_00.tag = in_stack_fffffffffffffed0, val_00.u.ptr = in_stack_fffffffffffffec8.ptr,
        iVar3 = JS_ToInt32Clamp(in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8.ptr,
                                val_00,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffed8._8_4_), iVar3 == 0)))) {
      max_int(uVar1 - local_f8,0);
      this_val_00.u._4_4_ = in_stack_fffffffffffffeac;
      this_val_00.u.int32 = in_stack_fffffffffffffea8;
      this_val_00.tag._0_4_ = in_stack_fffffffffffffeb0;
      this_val_00.tag._4_4_ = in_stack_fffffffffffffeb4;
      JVar4 = js_typed_array_get_byteOffset
                        ((JSContext *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         this_val_00,in_stack_fffffffffffffe9c);
      uVar8 = JVar4.u._0_4_;
      uVar9 = JVar4.u._4_4_;
      local_110 = JVar4.tag;
      iVar3 = JS_IsException(JVar4);
      if (iVar3 == 0) {
        v.u._4_4_ = in_stack_fffffffffffffe9c;
        v.u.int32 = in_stack_fffffffffffffe98;
        v.tag._0_4_ = in_stack_fffffffffffffea0;
        v.tag._4_4_ = in_stack_fffffffffffffea4;
        JS_FreeValue(in_stack_fffffffffffffe90,v);
        this_val_01.tag = (int64_t)in_stack_fffffffffffffec0;
        this_val_01.u.float64 = in_stack_fffffffffffffeb8.float64;
        JVar4 = js_typed_array_get_buffer
                          ((JSContext *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),this_val_01
                           ,in_stack_fffffffffffffeac);
        argc_00 = JVar4.u._4_4_;
        ctx_00 = (JSContext *)JVar4.tag;
        iVar3 = JS_IsException(JVar4);
        if (iVar3 == 0) {
          uVar5 = 0;
          uVar6 = 3;
          uVar7 = 0;
          this_val_02.u._4_4_ = uVar9;
          this_val_02.u.int32 = uVar8;
          this_val_02.tag = local_110;
          JVar4 = js_typed_array___speciesCreate(ctx_00,this_val_02,argc_00,(JSValue *)argv_00);
          local_48 = JVar4.tag;
          v_00.u._4_4_ = in_stack_fffffffffffffe9c;
          v_00.u.int32 = uVar5;
          v_00.tag._0_4_ = uVar6;
          v_00.tag._4_4_ = uVar7;
          JS_FreeValue(in_stack_fffffffffffffe90,v_00);
          local_50 = JVar4.u._0_4_;
          uStack_4c = JVar4.u._4_4_;
          goto LAB_001c2f7a;
        }
      }
    }
  }
  local_50 = 0;
  local_48 = 6;
LAB_001c2f7a:
  JVar2.u._4_4_ = uStack_4c;
  JVar2.u.int32 = local_50;
  JVar2.tag = local_48;
  return JVar2;
}

Assistant:

static JSValue js_typed_array_subarray(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst args[4];
    JSValue arr, byteOffset, ta_buffer;
    JSObject *p;
    int len, start, final, count, shift, offset;

    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        goto exception;
    len = p->u.array.count;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);
    byteOffset = js_typed_array_get_byteOffset(ctx, this_val, 0);
    if (JS_IsException(byteOffset))
        goto exception;
    shift = typed_array_size_log2(p->class_id);
    offset = JS_VALUE_GET_INT(byteOffset) + (start << shift);
    JS_FreeValue(ctx, byteOffset);
    ta_buffer = js_typed_array_get_buffer(ctx, this_val, 0);
    if (JS_IsException(ta_buffer))
        goto exception;
    args[0] = this_val;
    args[1] = ta_buffer;
    args[2] = JS_NewInt32(ctx, offset);
    args[3] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 4, args);
    JS_FreeValue(ctx, ta_buffer);
    return arr;

 exception:
    return JS_EXCEPTION;
}